

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O2

int __thiscall
QAbstractItemViewPrivate::delegateRefCount
          (QAbstractItemViewPrivate *this,QAbstractItemDelegate *delegate)

{
  Data *pDVar1;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar2;
  bool bVar3;
  QObject *pQVar4;
  _Rb_tree_node_base *p_Var5;
  uint uVar6;
  _Base_ptr p_Var7;
  uint uVar8;
  _Rb_tree_node_base *p_Var9;
  int maps;
  int iVar10;
  
  pDVar1 = (this->itemDelegate).wp.d;
  iVar10 = 0;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar4 = (this->itemDelegate).wp.value;
  }
  uVar8 = (uint)(pQVar4 == &delegate->super_QObject);
  do {
    if (iVar10 == 2) {
      return uVar8;
    }
    pQVar2 = (&this->rowDelegates)[iVar10 != 0].d.d.ptr;
    if (pQVar2 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                   *)0x0) {
      p_Var5 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var5 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl + 0x18);
    }
    p_Var9 = (_Rb_tree_node_base *)((long)&(pQVar2->m)._M_t._M_impl + 8);
    if (pQVar2 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                   *)0x0) {
      p_Var9 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var5 != p_Var9; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if ((p_Var5[1]._M_parent == (_Base_ptr)0x0) ||
         (*(int *)&(p_Var5[1]._M_parent)->field_0x4 == 0)) {
        p_Var7 = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = p_Var5[1]._M_left;
      }
      if ((p_Var7 == (_Base_ptr)delegate) &&
         (uVar6 = uVar8 + 1, bVar3 = 0 < (int)uVar8, uVar8 = uVar6, bVar3)) {
        return uVar6;
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int delegateRefCount(const QAbstractItemDelegate *delegate) const
    {
        int ref = 0;
        if (itemDelegate == delegate)
            ++ref;

        for (int maps = 0; maps < 2; ++maps) {
            const QMap<int, QPointer<QAbstractItemDelegate> > *delegates = maps ? &columnDelegates : &rowDelegates;
            for (QMap<int, QPointer<QAbstractItemDelegate> >::const_iterator it = delegates->begin();
                it != delegates->end(); ++it) {
                    if (it.value() == delegate) {
                        ++ref;
                        // optimization, we are only interested in the ref count values 0, 1 or >=2
                        if (ref >= 2) {
                            return ref;
                        }
                    }
            }
        }
        return ref;
    }